

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O2

void ggml_gallocr_free(ggml_gallocr_t galloc)

{
  ggml_backend_buffer_t *ppgVar1;
  ggml_dyn_tallocr **ppgVar2;
  ggml_backend_buffer_t *ppgVar3;
  ggml_dyn_tallocr **ppgVar4;
  int j;
  long lVar5;
  int i;
  long lVar6;
  
  if (galloc == (ggml_gallocr_t)0x0) {
    return;
  }
  lVar6 = 0;
  do {
    if (galloc->n_buffers <= lVar6) {
      ggml_hash_set_free(&galloc->hash_set);
      free(galloc->hash_values);
      free(galloc->bufts);
      free(galloc->buffers);
      free(galloc->buf_tallocs);
      free(galloc->node_allocs);
      free(galloc->leaf_allocs);
      free(galloc);
      return;
    }
    ppgVar3 = galloc->buffers;
    if (ppgVar3 != (ggml_backend_buffer_t *)0x0) {
      lVar5 = 0;
      do {
        if (lVar6 == lVar5) {
          ggml_backend_buffer_free(ppgVar3[lVar6]);
          break;
        }
        ppgVar1 = ppgVar3 + lVar5;
        lVar5 = lVar5 + 1;
      } while (*ppgVar1 != ppgVar3[lVar6]);
    }
    ppgVar4 = galloc->buf_tallocs;
    if (ppgVar4 != (ggml_dyn_tallocr **)0x0) {
      lVar5 = 0;
      do {
        if (lVar6 == lVar5) {
          free(ppgVar4[lVar6]);
          break;
        }
        ppgVar2 = ppgVar4 + lVar5;
        lVar5 = lVar5 + 1;
      } while (*ppgVar2 != ppgVar4[lVar6]);
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void ggml_gallocr_free(ggml_gallocr_t galloc) {
    if (galloc == NULL) {
        return;
    }

    for (int i = 0; i < galloc->n_buffers; i++) {
        if (galloc->buffers != NULL) {
            // skip if already freed
            bool freed = false;
            for (int j = 0; j < i; j++) {
                if (galloc->buffers[j] == galloc->buffers[i]) {
                    freed = true;
                    break;
                }
            }
            if (!freed) {
                ggml_backend_buffer_free(galloc->buffers[i]);
            }
        }
        if (galloc->buf_tallocs != NULL) {
            // skip if already freed
            bool freed = false;
            for (int j = 0; j < i; j++) {
                if (galloc->buf_tallocs[j] == galloc->buf_tallocs[i]) {
                    freed = true;
                    break;
                }
            }
            if (!freed) {
                ggml_dyn_tallocr_free(galloc->buf_tallocs[i]);
            }
        }
    }

    ggml_hash_set_free(&galloc->hash_set);
    free(galloc->hash_values);
    free(galloc->bufts);
    free(galloc->buffers);
    free(galloc->buf_tallocs);
    free(galloc->node_allocs);
    free(galloc->leaf_allocs);
    free(galloc);
}